

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_amend.c
# Opt level: O0

LY_ERR lys_precompile_nodeid(ly_ctx *ctx,char *str,lysc_nodeid **nodeid)

{
  size_t expr_len;
  lysc_nodeid *plVar1;
  char **ppcVar2;
  char *pcVar3;
  uint local_54;
  ulong uStack_50;
  uint32_t i;
  size_t len;
  char *name;
  char *ptr;
  void *mem;
  lyxp_expr *exp;
  lysc_nodeid **pplStack_20;
  LY_ERR rc;
  lysc_nodeid **nodeid_local;
  char *str_local;
  ly_ctx *ctx_local;
  
  exp._4_4_ = 0;
  mem = (void *)0x0;
  *nodeid = (lysc_nodeid *)0x0;
  pplStack_20 = nodeid;
  nodeid_local = (lysc_nodeid **)str;
  str_local = (char *)ctx;
  expr_len = strlen(str);
  exp._4_4_ = lyxp_expr_parse(ctx,str,expr_len,'\0',(lyxp_expr **)&mem);
  if (exp._4_4_ == LY_SUCCESS) {
    plVar1 = (lysc_nodeid *)calloc(1,0x20);
    *pplStack_20 = plVar1;
    if (*pplStack_20 == (lysc_nodeid *)0x0) {
      ly_log((ly_ctx *)str_local,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
             "lys_precompile_nodeid");
      exp._4_4_ = LY_EMEM;
    }
    else {
      (*pplStack_20)->str = (char *)nodeid_local;
      local_54 = 0;
      if (**mem != 10) goto LAB_0017f37f;
      while (ppcVar2 = (char **)realloc((*pplStack_20)->prefix,
                                        (ulong)((*pplStack_20)->count + 1) << 3),
            ppcVar2 != (char **)0x0) {
        (*pplStack_20)->prefix = ppcVar2;
        (*pplStack_20)->prefix[(*pplStack_20)->count] = (char *)0x0;
        ppcVar2 = (char **)realloc((*pplStack_20)->name,(ulong)((*pplStack_20)->count + 1) << 3);
        if (ppcVar2 == (char **)0x0) {
          ly_log((ly_ctx *)str_local,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                 "lys_precompile_nodeid");
          exp._4_4_ = LY_EMEM;
          goto LAB_0017f619;
        }
        (*pplStack_20)->name = ppcVar2;
        (*pplStack_20)->name[(*pplStack_20)->count] = (char *)0x0;
        (*pplStack_20)->count = (*pplStack_20)->count + 1;
        if (*(int *)(*mem + (ulong)local_54 * 4) != 10) {
          __assert_fail("exp->tokens[i] == LYXP_TOKEN_NAMETEST",
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile_amend.c"
                        ,0x79,
                        "LY_ERR lys_precompile_nodeid(const struct ly_ctx *, const char *, struct lysc_nodeid **)"
                       );
        }
        len = (long)nodeid_local + (ulong)*(uint *)(*(long *)((long)mem + 8) + (ulong)local_54 * 4);
        uStack_50 = (ulong)*(uint *)(*(long *)((long)mem + 0x10) + (ulong)local_54 * 4);
        pcVar3 = ly_strnchr((char *)len,0x3a,uStack_50);
        if (pcVar3 != (char *)0x0) {
          exp._4_4_ = lydict_insert((ly_ctx *)str_local,(char *)len,(long)pcVar3 - len,
                                    (*pplStack_20)->prefix + ((*pplStack_20)->count - 1));
          if (exp._4_4_ != LY_SUCCESS) goto LAB_0017f619;
          uStack_50 = uStack_50 - (long)(pcVar3 + (1 - len));
          len = (size_t)(pcVar3 + 1);
          exp._4_4_ = LY_SUCCESS;
        }
        exp._4_4_ = lydict_insert((ly_ctx *)str_local,(char *)len,uStack_50,
                                  (*pplStack_20)->name + ((*pplStack_20)->count - 1));
        if (exp._4_4_ != LY_SUCCESS) goto LAB_0017f619;
        local_54 = local_54 + 1;
LAB_0017f37f:
        if (*(uint *)((long)mem + 0x20) <= local_54) goto LAB_0017f619;
        if (*(int *)(*mem + (ulong)local_54 * 4) != 0x14) {
          __assert_fail("exp->tokens[i] == LYXP_TOKEN_OPER_PATH",
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile_amend.c"
                        ,0x67,
                        "LY_ERR lys_precompile_nodeid(const struct ly_ctx *, const char *, struct lysc_nodeid **)"
                       );
        }
        local_54 = local_54 + 1;
      }
      ly_log((ly_ctx *)str_local,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
             "lys_precompile_nodeid");
      exp._4_4_ = LY_EMEM;
    }
  }
LAB_0017f619:
  lyxp_expr_free((ly_ctx *)str_local,(lyxp_expr *)mem);
  if (exp._4_4_ != LY_SUCCESS) {
    lysc_nodeid_free((ly_ctx *)str_local,*pplStack_20);
    *pplStack_20 = (lysc_nodeid *)0x0;
  }
  return exp._4_4_;
}

Assistant:

static LY_ERR
lys_precompile_nodeid(const struct ly_ctx *ctx, const char *str, struct lysc_nodeid **nodeid)
{
    LY_ERR rc = LY_SUCCESS;
    struct lyxp_expr *exp = NULL;
    void *mem;
    const char *ptr, *name;
    size_t len;
    uint32_t i;

    *nodeid = NULL;

    /* parse */
    rc = lyxp_expr_parse(ctx, str, strlen(str), 0, &exp);
    LY_CHECK_GOTO(rc, cleanup);

    /* alloc */
    *nodeid = calloc(1, sizeof **nodeid);
    LY_CHECK_ERR_GOTO(!*nodeid, LOGMEM(ctx); rc = LY_EMEM, cleanup);

    /* store the full schema-node-id */
    (*nodeid)->str = str;

    /* absolute vs. relative path */
    i = 0;
    if (exp->tokens[0] == LYXP_TOKEN_NAMETEST) {
        goto relative_path;
    }

    while (i < exp->used) {
        /* skip '/' */
        assert(exp->tokens[i] == LYXP_TOKEN_OPER_PATH);
        ++i;

relative_path:
        /* new node */
        mem = realloc((*nodeid)->prefix, ((*nodeid)->count + 1) * sizeof *(*nodeid)->prefix);
        LY_CHECK_ERR_GOTO(!mem, LOGMEM(ctx); rc = LY_EMEM, cleanup);
        (*nodeid)->prefix = mem;
        (*nodeid)->prefix[(*nodeid)->count] = NULL;

        mem = realloc((*nodeid)->name, ((*nodeid)->count + 1) * sizeof *(*nodeid)->name);
        LY_CHECK_ERR_GOTO(!mem, LOGMEM(ctx); rc = LY_EMEM, cleanup);
        (*nodeid)->name = mem;
        (*nodeid)->name[(*nodeid)->count] = NULL;

        ++(*nodeid)->count;

        /* compile the name test */
        assert(exp->tokens[i] == LYXP_TOKEN_NAMETEST);
        name = str + exp->tok_pos[i];
        len = exp->tok_len[i];
        ptr = ly_strnchr(name, ':', len);
        if (ptr) {
            /* store prefix */
            rc = lydict_insert(ctx, name, ptr - name, &(*nodeid)->prefix[(*nodeid)->count - 1]);
            LY_CHECK_GOTO(rc, cleanup);

            /* move name */
            len -= (ptr - name) + 1;
            name = ptr + 1;
        }

        /* store name */
        rc = lydict_insert(ctx, name, len, &(*nodeid)->name[(*nodeid)->count - 1]);
        LY_CHECK_GOTO(rc, cleanup);

        ++i;
    }

cleanup:
    lyxp_expr_free(ctx, exp);
    if (rc) {
        lysc_nodeid_free(ctx, *nodeid);
        *nodeid = NULL;
    }
    return rc;
}